

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondOrderParameter.cpp
# Opt level: O3

void __thiscall
OpenMD::BondOrderParameter::BondOrderParameter
          (BondOrderParameter *this,SimInfo *info,string *filename,string *sele,double rCut,
          uint nbins)

{
  SelectionEvaluator *this_00;
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  iterator __position;
  double dVar3;
  double __x;
  long *plVar4;
  ostream *this_01;
  RealType *thrcof;
  mapped_type *pmVar5;
  vector<double,std::allocator<double>> *this_02;
  OpenMDBitSet *pOVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  RealType *__args;
  RealType m2M;
  RealType m2m;
  string paramString;
  pair<int,_int> lm;
  int error;
  stringstream params;
  uint local_254;
  double local_238;
  double local_230;
  string local_228;
  string *local_208;
  vector<int,_std::allocator<int>_> *local_200;
  vector<int,_std::allocator<int>_> *local_1f8;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *local_1f0;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *local_1e8;
  SelectionManager *local_1e0;
  double local_1d8;
  size_t local_1d0;
  key_type local_1c8;
  int local_1bc;
  undefined1 local_1b8 [16];
  OpenMDBitSet local_1a8 [2];
  ios_base local_138 [264];
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser =
       (_func_int **)&PTR__BondOrderParameter_00335d68;
  local_208 = &this->selectionScript_;
  (this->selectionScript_)._M_dataplus._M_p = (pointer)&(this->selectionScript_).field_2;
  pcVar2 = (sele->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_208,pcVar2,pcVar2 + sele->_M_string_length);
  local_1e0 = &this->seleMan_;
  SelectionManager::SelectionManager(local_1e0,info);
  this_00 = &this->evaluator_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  local_1e8 = &this->m2Min;
  p_Var1 = &(this->m2Min)._M_t._M_impl.super__Rb_tree_header;
  (this->m2Min)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m2Min)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m2Min)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m2Min)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m2Min)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1f0 = &this->m2Max;
  p_Var1 = &(this->m2Max)._M_t._M_impl.super__Rb_tree_header;
  (this->m2Max)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m2Max)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m2Max)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m2Max)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m2Max)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->w3j)._M_t._M_impl.super__Rb_tree_header;
  (this->w3j)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->w3j)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->w3j)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->w3j)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->w3j)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1f8 = &this->Qcount_;
  (this->Qcount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->Qcount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->Qcount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->Q_histogram_)._M_t._M_impl.super__Rb_tree_header;
  (this->Q_histogram_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Q_histogram_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Q_histogram_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Q_histogram_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Q_histogram_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_200 = &this->Wcount_;
  (this->Wcount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->Wcount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->Wcount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  p_Var1 = &(this->W_histogram_)._M_t._M_impl.super__Rb_tree_header;
  (this->W_histogram_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->W_histogram_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->W_histogram_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->W_histogram_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->W_histogram_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1b8._0_8_ = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Bond Order Parameters","");
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).analysisType_);
  if ((OpenMDBitSet *)local_1b8._0_8_ != local_1a8) {
    operator_delete((void *)local_1b8._0_8_,
                    (ulong)((long)&(((vector<bool,_std::allocator<bool>_> *)
                                    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           1));
  }
  getPrefix(&local_228,filename);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_228);
  pOVar6 = (OpenMDBitSet *)(plVar4 + 2);
  if ((OpenMDBitSet *)*plVar4 == pOVar6) {
    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p =
         (pOVar6->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._8_8_ = plVar4[3];
    local_1b8._0_8_ = local_1a8;
  }
  else {
    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p =
         (pOVar6->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_1b8._0_8_ = (OpenMDBitSet *)*plVar4;
  }
  local_1b8._8_8_ = plVar4[1];
  *plVar4 = (long)pOVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  if ((OpenMDBitSet *)local_1b8._0_8_ != local_1a8) {
    operator_delete((void *)local_1b8._0_8_,
                    (ulong)((long)&(((vector<bool,_std::allocator<bool>_> *)
                                    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  SelectionEvaluator::loadScriptString(this_00,sele);
  if ((this->evaluator_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)local_1b8,this_00);
    lVar8 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar8),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((vector<bool,_std::allocator<bool>_> *)local_1b8._0_8_)->
                         super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar8));
      lVar8 = lVar8 + 0x28;
    } while (lVar8 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_1b8);
  }
  this->rCut_ = rCut;
  this->nBins_ = nbins;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," rcut = ",8);
  this_01 = std::ostream::_M_insert<double>(this->rCut_);
  std::__ostream_insert<char,std::char_traits<char>>(this_01,", nbins = ",10);
  std::ostream::operator<<((ostream *)this_01,this->nBins_);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).paramString_);
  std::vector<int,_std::allocator<int>_>::resize(local_1f8,0xd);
  std::vector<int,_std::allocator<int>_>::resize(local_200,0xd);
  *(undefined4 *)&this->MinQ_ = 0;
  *(undefined4 *)((long)&this->MinQ_ + 4) = 0;
  *(undefined4 *)&this->MaxQ_ = 0x9999999a;
  *(undefined4 *)((long)&this->MaxQ_ + 4) = 0x3ff19999;
  this->deltaQ_ = 1.1 / (double)this->nBins_;
  this->MinW_ = -1.1;
  this->MaxW_ = 1.1;
  this->deltaW_ = 2.2 / (double)this->nBins_;
  thrcof = (RealType *)operator_new__(200);
  local_254 = 1;
  uVar7 = 0;
  do {
    local_1d0 = uVar7 << 4 | 8;
    local_1d8 = (double)(int)uVar7;
    uVar9 = -(int)uVar7;
    do {
      local_1c8 = (key_type)((ulong)uVar9 << 0x20 | uVar7);
      memset(thrcof,0,local_1d0);
      MATPACK::Wigner3jm(local_1d8,local_1d8,local_1d8,(double)(int)uVar9,&local_230,&local_238,
                         thrcof,0x19,&local_1bc);
      dVar3 = local_230;
      pmVar5 = std::
               map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::operator[](local_1e8,&local_1c8);
      dVar3 = floor(dVar3);
      __x = local_238;
      *pmVar5 = (int)dVar3;
      pmVar5 = std::
               map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::operator[](local_1f0,&local_1c8);
      dVar3 = floor(__x);
      *pmVar5 = (int)dVar3;
      if (-1 < (int)(local_238 - local_230)) {
        lVar8 = -1;
        __args = thrcof;
        do {
          this_02 = (vector<double,std::allocator<double>> *)
                    std::
                    map<std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
                    ::operator[](&this->w3j,&local_1c8);
          __position._M_current = *(double **)(this_02 + 8);
          if (__position._M_current == *(double **)(this_02 + 0x10)) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      (this_02,__position,__args);
          }
          else {
            *__position._M_current = *__args;
            *(double **)(this_02 + 8) = __position._M_current + 1;
          }
          lVar8 = lVar8 + 1;
          __args = __args + 1;
        } while (lVar8 < (int)(local_238 - local_230));
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != local_254);
    uVar7 = uVar7 + 1;
    local_254 = local_254 + 1;
  } while (uVar7 != 0xd);
  operator_delete__(thrcof);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

BondOrderParameter::BondOrderParameter(SimInfo* info,
                                         const std::string& filename,
                                         const std::string& sele, double rCut,
                                         unsigned int nbins) :
      StaticAnalyser(info, filename, nbins),
      selectionScript_(sele), seleMan_(info), evaluator_(info) {
    setAnalysisType("Bond Order Parameters");
    setOutputName(getPrefix(filename) + ".bo");

    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    // Set up cutoff radius and order of the Legendre Polynomial:

    rCut_  = rCut;
    nBins_ = nbins;

    std::stringstream params;
    params << " rcut = " << rCut_ << ", nbins = " << nBins_;
    const std::string paramString = params.str();
    setParameterString(paramString);

    Qcount_.resize(lMax_ + 1);
    Wcount_.resize(lMax_ + 1);

    // Q can take values from 0 to 1

    MinQ_   = 0.0;
    MaxQ_   = 1.1;
    deltaQ_ = (MaxQ_ - MinQ_) / (nBins_);

    // W_6 for icosahedral clusters is 11 / sqrt(4199) = 0.169754, so we'll
    // use values for MinW_ and MaxW_ that are slightly larger than this:

    MinW_   = -1.1;
    MaxW_   = 1.1;
    deltaW_ = (MaxW_ - MinW_) / (nBins_);

    // Make arrays for Wigner3jm
    RealType* THRCOF = new RealType[2 * lMax_ + 1];
    // Variables for Wigner routine
    RealType lPass, m1Pass, m2m, m2M;
    int error, mSize;
    mSize = 2 * lMax_ + 1;

    for (int l = 0; l <= lMax_; l++) {
      lPass = (RealType)l;
      for (int m1 = -l; m1 <= l; m1++) {
        m1Pass = (RealType)m1;

        std::pair<int, int> lm = std::make_pair(l, m1);

        // Zero work array
        for (int ii = 0; ii < 2 * l + 1; ii++) {
          THRCOF[ii] = 0.0;
        }

        // Get Wigner coefficients
        Wigner3jm(lPass, lPass, lPass, m1Pass, m2m, m2M, THRCOF, mSize, error);

        m2Min[lm] = (int)floor(m2m);
        m2Max[lm] = (int)floor(m2M);

        for (int mmm = 0; mmm <= (int)(m2M - m2m); mmm++) {
          w3j[lm].push_back(THRCOF[mmm]);
        }
      }
    }
    delete[] THRCOF;
    THRCOF = NULL;
  }